

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O3

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::
read_chunked_transfer_encoded_chunk
          (ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
          *session,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf,
          unsigned_long length)

{
  element_type *peVar1;
  element_type *peVar2;
  _Manager_type p_Var3;
  void *pvVar4;
  Response *this_00;
  undefined *__n;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
  response;
  ostream ostream;
  ostream tmp_stream;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>
  local_278;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
  local_268;
  Response *local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  undefined1 local_248 [8];
  error_category *local_240;
  __node_base local_238;
  size_type sStack_230;
  _Prime_rehash_policy local_228;
  __node_base_ptr ap_Stack_218 [28];
  char local_138 [8];
  ios_base local_130 [264];
  
  std::ostream::ostream
            (local_138,
             &((chunks_streambuf->
               super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->super_streambuf);
  if (length != 0) {
    pvVar4 = operator_new__(length);
    std::istream::read((char *)&((((session->
                                   super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->request).
                                 super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->content,(long)pvVar4);
    std::ostream::write(local_138,(long)pvVar4);
    peVar1 = (chunks_streambuf->
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    __n = (undefined *)(*(long *)&peVar1->field_0x28 - *(long *)&peVar1->field_0x10);
    if (__n == (undefined *)peVar1->max_size_) {
      this_00 = (Response *)operator_new(0x170);
      local_268.
      super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (session->
                super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_268.
      super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (session->
           super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_268.
          super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        __n = &__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_268.
           super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_268.
                super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_268.
           super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_268.
                super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Response::Response(this_00,&local_268,(this->config).timeout_content);
      std::
      __shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response,(__gnu_cxx::_Lock_policy)2>
      ::
      __shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response,void>
                ((__shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response,(__gnu_cxx::_Lock_policy)2>
                  *)&local_258,this_00);
      if (local_268.
          super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.
                   super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_248 = (undefined1  [8])ap_Stack_218;
      local_240 = (error_category *)0x1;
      local_238._M_nxt = (_Hash_node_base *)0x0;
      sStack_230 = 0;
      local_228._M_max_load_factor = 1.0;
      local_228._4_4_ = 0;
      local_228._M_next_resize = 0;
      ap_Stack_218[0] = (__node_base_ptr)0x0;
      Response::write(local_258,0x19d,local_248,(size_t)__n);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                     *)local_248);
      if ((this->on_error).super__Function_base._M_manager != (_Manager_type)0x0) {
        peVar2 = (session->
                 super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_278.
        super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (peVar2->request).
                  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_278.
        super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (peVar2->request).
             super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_278.
            super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0012bebf:
          local_240 = (error_category *)std::_V2::generic_category();
          local_248._0_4_ = 0x5a;
        }
        else {
          if (__libc_single_threaded != '\0') {
            (local_278.
             super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_278.
                  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            goto LAB_0012bebf;
          }
          LOCK();
          (local_278.
           super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_278.
                super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
          p_Var3 = (this->on_error).super__Function_base._M_manager;
          local_240 = (error_category *)std::_V2::generic_category();
          local_248._0_4_ = 0x5a;
          if (p_Var3 == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
        }
        (*(this->on_error)._M_invoker)
                  ((_Any_data *)&this->on_error,&local_278,(error_code *)local_248);
        if (local_278.
            super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_278.
                     super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
      }
      operator_delete__(pvVar4);
      goto LAB_0012bf31;
    }
    operator_delete__(pvVar4);
  }
  std::istream::get();
  std::istream::get();
  if (length == 0) {
    peVar1 = (chunks_streambuf->
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (*(long *)&peVar1->field_0x28 != *(long *)&peVar1->field_0x10) {
      std::ostream::ostream
                (local_248,
                 (streambuf *)
                 (((session->
                   super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->request).
                 super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::ostream::operator<<
                (local_248,
                 &((chunks_streambuf->
                   super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->super_streambuf);
      std::ios_base::~ios_base((ios_base *)&local_240);
    }
    find_resource(this,session);
  }
  else {
    read_chunked_transfer_encoded(this,session,chunks_streambuf);
  }
LAB_0012bf31:
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void read_chunked_transfer_encoded_chunk(const std::shared_ptr<Session> &session, const std::shared_ptr<asio::streambuf> &chunks_streambuf, unsigned long length) {
      std::ostream tmp_stream(chunks_streambuf.get());
      if(length > 0) {
        std::unique_ptr<char[]> buffer(new char[length]);
        session->request->content.read(buffer.get(), static_cast<std::streamsize>(length));
        tmp_stream.write(buffer.get(), static_cast<std::streamsize>(length));
        if(chunks_streambuf->size() == chunks_streambuf->max_size()) {
          auto response = std::shared_ptr<Response>(new Response(session, this->config.timeout_content));
          response->write(StatusCode::client_error_payload_too_large);
          if(this->on_error)
            this->on_error(session->request, make_error_code::make_error_code(errc::message_size));
          return;
        }
      }

      // Remove "\r\n"
      session->request->content.get();
      session->request->content.get();

      if(length > 0)
        read_chunked_transfer_encoded(session, chunks_streambuf);
      else {
        if(chunks_streambuf->size() > 0) {
          std::ostream ostream(&session->request->streambuf);
          ostream << chunks_streambuf.get();
        }
        this->find_resource(session);
      }
    }